

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.h
# Opt level: O0

int av1_get_dx(int angle)

{
  int angle_local;
  int local_4;
  
  if ((angle < 1) || (0x59 < angle)) {
    if ((angle < 0x5b) || (0xb3 < angle)) {
      local_4 = 1;
    }
    else {
      local_4 = (int)dr_intra_derivative[0xb4 - angle];
    }
  }
  else {
    local_4 = (int)dr_intra_derivative[angle];
  }
  return local_4;
}

Assistant:

static inline int av1_get_dx(int angle) {
  if (angle > 0 && angle < 90) {
    return dr_intra_derivative[angle];
  } else if (angle > 90 && angle < 180) {
    return dr_intra_derivative[180 - angle];
  } else {
    // In this case, we are not really going to use dx. We may return any value.
    return 1;
  }
}